

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O3

double __thiscall NEST::LArNEST::GetLinearEnergyTransfer(LArNEST *this,double energy,bool CSDA)

{
  undefined3 in_register_00000031;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (CONCAT31(in_register_00000031,CSDA) == 0) {
    dVar1 = log10(energy);
    dVar5 = log10(energy);
    dVar6 = log10(energy);
    dVar6 = pow(dVar6,3.0);
    dVar7 = log10(energy);
    dVar7 = pow(dVar7,4.0);
    dVar8 = log10(energy);
    dVar8 = pow(dVar8,5.0);
    dVar9 = log10(energy);
    dVar9 = pow(dVar9,6.0);
    dVar2 = log10(energy);
    dVar2 = pow(dVar2,7.0);
    dVar3 = log10(energy);
    dVar3 = pow(dVar3,8.0);
    dVar4 = log10(energy);
    dVar4 = pow(dVar4,9.0);
    dVar1 = pow(10.0,dVar1 * -0.45086 + 1.8106 + dVar5 * dVar5 * -0.33151 + dVar6 * 0.25916 +
                     dVar7 * -0.2051 + dVar8 * 0.15279 + dVar9 * -0.084659 + dVar2 * 0.030441 +
                     dVar3 * -0.0058953 + dVar4 * 0.00045633);
    dVar1 = (double)(-(ulong)(dVar1 <= 0.0) & 0x4059000000000000 |
                    ~-(ulong)(dVar1 <= 0.0) & (ulong)dVar1);
  }
  else if (1.0 <= energy) {
    dVar1 = log10(energy);
    dVar5 = log10(energy);
    dVar6 = log10(energy);
    dVar6 = pow(dVar6,3.0);
    dVar7 = log10(energy);
    dVar7 = pow(dVar7,4.0);
    dVar8 = log10(energy);
    dVar8 = pow(dVar8,5.0);
    dVar9 = log10(energy);
    dVar9 = pow(dVar9,6.0);
    dVar1 = dVar9 * 0.031563 +
            dVar8 * -0.69334 +
            dVar7 * 6.5069 + dVar6 * -33.405 + dVar5 * dVar5 * 99.361 + dVar1 * -162.97 + 116.7;
  }
  else {
    dVar1 = (double)(-(ulong)(energy < 1.0) & 0x4059000000000000 & -(ulong)(0.0 < energy));
  }
  return dVar1;
}

Assistant:

double LArNEST::GetLinearEnergyTransfer(double energy, bool CSDA) {
  double LET;
  if (!CSDA) {  // total stopping power directly from ESTAR (radiative +
                // collision)
    LET = 1.8106 - 0.45086 * log10(energy) - 0.33151 * pow(log10(energy), 2.) +
          0.25916 * pow(log10(energy), 3.) - 0.2051 * pow(log10(energy), 4.) +
          0.15279 * pow(log10(energy), 5.) - 0.084659 * pow(log10(energy), 6.) +
          0.030441 * pow(log10(energy), 7.) -
          0.0058953 * pow(log10(energy), 8.) +
          0.00045633 * pow(log10(energy), 9.);
    LET = pow(10., LET);
    if (std::isnan(LET) || LET <= 0.) {
      LET = 1e2;
    }
  } else {
    // the "continuous slowing down approximation" (CSDA)
    // replace with Justin and Prof. Mooney's work
    if (energy >= 1.) {
      LET = 116.70 - 162.97 * log10(energy) + 99.361 * pow(log10(energy), 2) -
            33.405 * pow(log10(energy), 3) + 6.5069 * pow(log10(energy), 4) -
            0.69334 * pow(log10(energy), 5) + 0.031563 * pow(log10(energy), 6);
    } else if (energy > 0. && energy < 1.) {
      LET = 100.;
    } else {
      LET = 0.;
    }
  }
  return LET;
}